

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

Token * __thiscall
onmt::Tokenizer::annotate_token(Token *__return_storage_ptr__,Tokenizer *this,string *word)

{
  string *suffix;
  bool bVar1;
  string asStack_48 [32];
  
  (__return_storage_ptr__->surface)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->surface).field_2;
  (__return_storage_ptr__->surface)._M_string_length = 0;
  (__return_storage_ptr__->surface).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->features).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->features).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->features).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->type = Word;
  __return_storage_ptr__->casing = None;
  __return_storage_ptr__->join_left = false;
  __return_storage_ptr__->join_right = false;
  __return_storage_ptr__->spacer = false;
  __return_storage_ptr__->preserve = false;
  if ((this->_options).spacer_annotate == true) {
    bVar1 = starts_with(word,(string *)spacer_marker_abi_cxx11_);
    if (!bVar1) {
      __return_storage_ptr__->join_left = true;
    }
  }
  else {
    suffix = &(this->_options).joiner;
    bVar1 = ends_with(word,suffix);
    if (bVar1) {
      __return_storage_ptr__->join_right = true;
    }
    bVar1 = starts_with(word,suffix);
    if (bVar1) {
      __return_storage_ptr__->join_left = true;
    }
  }
  std::__cxx11::string::substr((ulong)asStack_48,(ulong)word);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::annotate_token(const std::string& word) const
  {
    Token token;
    size_t subpos = 0;
    size_t sublen = word.size();

    if (_options.spacer_annotate)
    {
      if (starts_with(word, spacer_marker))
      {
        subpos += spacer_marker.length();
        sublen -= spacer_marker.length();
      }
      else
        token.join_left = true;
    }
    else
    {
      if (ends_with(word, _options.joiner))
      {
        token.join_right = true;
        sublen -= _options.joiner.length();
      }
      if (starts_with(word, _options.joiner))
      {
        token.join_left = true;
        subpos += _options.joiner.length();
        sublen -= _options.joiner.length();
      }
    }

    token.surface = word.substr(subpos, sublen);
    return token;
  }